

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.cpp
# Opt level: O3

BaseExpressionPtr __thiscall
Kandinsky::VariableExpression::derivative(VariableExpression *this,VariableExpressionPtr *variable)

{
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  uint uVar2;
  BaseExpressionPtr BVar3;
  undefined1 local_59;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  undefined1 local_40 [16];
  _Any_data local_30;
  _Manager_type local_20;
  code *local_18;
  
  if ((VariableExpressionPtr *)*in_RDX == variable) {
    uVar2 = 0x3ff00000;
  }
  else {
    uVar2 = 0;
  }
  local_40._0_8_ = &PTR_evaluate_00110ad8;
  local_40._8_8_ = (ulong)uVar2 << 0x20;
  local_30._8_8_ = 0;
  local_30._M_unused._M_object = defaultFormatter_abi_cxx11_;
  local_18 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(double)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(double)>
             ::_M_manager;
  local_58 = (Constant *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::Constant,std::allocator<Kandinsky::Constant>,Kandinsky::Constant_const&>
            (a_Stack_50,(Constant **)&local_58,(allocator<Kandinsky::Constant> *)&local_59,
             (Constant *)local_40);
  *(undefined4 *)&(this->super_BaseExpression)._vptr_BaseExpression = (undefined4)local_58;
  *(undefined4 *)((long)&(this->super_BaseExpression)._vptr_BaseExpression + 4) = local_58._4_4_;
  *(undefined4 *)&this->m_value = a_Stack_50[0]._M_pi._0_4_;
  *(undefined4 *)((long)&this->m_value + 4) = a_Stack_50[0]._M_pi._4_4_;
  local_40._0_8_ = &PTR_evaluate_00110ad8;
  _Var1._M_pi = extraout_RDX;
  if (local_20 != (_Manager_type)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
    _Var1._M_pi = extraout_RDX_00;
  }
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_BaseExpression;
  return (BaseExpressionPtr)
         BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr VariableExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(Constant(variable.get() == this));
    }